

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::RequiresError::~RequiresError(RequiresError *this)

{
  void *in_RDI;
  
  ~RequiresError((RequiresError *)0x1e7798);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}